

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall QtMWidgets::DateTimePickerPrivate::releaseScrolling(DateTimePickerPrivate *this)

{
  reference pSVar1;
  
  this->leftMouseButtonPressed = false;
  if ((long)this->movableSection != -1) {
    pSVar1 = QList<QtMWidgets::Section>::operator[]
                       (&(this->super_DateTimeParser).sections,(long)this->movableSection);
    pSVar1->offset = 0;
  }
  updateDaysIfNeeded(this);
  updateCurrentDateTime(this);
  this->movableSection = -1;
  QWidget::update();
  return;
}

Assistant:

void
DateTimePickerPrivate::releaseScrolling()
{
	leftMouseButtonPressed = false;

	clearOffset();
	updateDaysIfNeeded();
	updateCurrentDateTime();

	movableSection = -1;

	q->update();
}